

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::warning<unsigned_int&>
          (ValidationContext *this,IssueWarning *issue,uint *args)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  basic_string_view<char,_std::char_traits<char>_> s_00;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  underlying_type_t<ktx::ReturnCode> uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  char *pcVar3;
  ValidationReport *this_00;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *in_RDX;
  ValidationReport *extraout_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  ValidationReport *in_stack_fffffffffffffd08;
  ValidationReport *__args;
  ValidationReport *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  v10 *pvVar4;
  char *in_stack_fffffffffffffd20;
  allocator<char> *in_stack_fffffffffffffd40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  uint *local_280;
  allocator<char> local_269;
  undefined1 local_268;
  undefined2 local_266;
  v10 avStack_240 [32];
  uint *local_220;
  undefined8 local_218;
  allocator<char> local_1f9;
  undefined1 local_1f8;
  undefined2 local_1f6;
  v10 avStack_1d0 [32];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_1b0;
  undefined1 *local_1a8;
  ValidationReport *local_198 [2];
  undefined8 local_188;
  ValidationReport **local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_168;
  v10 *local_150;
  ValidationReport **local_148;
  undefined8 *local_140;
  ValidationReport **local_138;
  undefined8 local_130;
  undefined8 *local_128;
  ValidationReport **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_118 [3];
  undefined8 local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *local_e0
  ;
  uint *local_d8;
  undefined8 uStack_d0;
  v10 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_c0;
  undefined8 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_98;
  longlong local_90;
  unsigned_long_long in_stack_ffffffffffffff78;
  unsigned_long_long uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  uint **ppuVar6;
  size_t in_stack_ffffffffffffff90;
  size_t sVar7;
  
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    pcVar3 = (char *)(in_RDI + 8);
    local_268 = *in_RSI;
    local_266 = *(undefined2 *)(in_RSI + 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    pvVar4 = avStack_240;
    sVar7 = *(size_t *)(local_1a8 + 0x18);
    s_00._M_str = pcVar3;
    s_00._M_len = (size_t)pvVar4;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffd10,s_00);
    local_168 = local_1b0;
    local_150 = pvVar4;
    this_00 = (ValidationReport *)
              ::fmt::v10::
              make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                        (local_1b0,pvVar4,local_280);
    local_140 = &local_188;
    local_148 = local_198;
    local_130 = 2;
    local_188 = 2;
    fmt_00.size_ = sVar7;
    fmt_00.data_ = in_stack_ffffffffffffff88;
    args_01.field_1.values_ = in_stack_ffffffffffffff80.values_;
    args_01.desc_ = in_stack_ffffffffffffff78;
    __args = extraout_RDX;
    local_198[0] = this_00;
    local_138 = local_148;
    local_128 = local_140;
    local_120 = local_148;
    local_180 = local_148;
    ::fmt::v10::vformat_abi_cxx11_(fmt_00,args_01);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)this_00,__args);
    ValidationReport::~ValidationReport(this_00);
    std::allocator<char>::~allocator(&local_269);
  }
  else {
    uVar1 = ktx::operator+(SUCCESS);
    *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
    local_1f8 = 1;
    local_1f6 = *(undefined2 *)(local_1a8 + 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    pvVar4 = avStack_1d0;
    aVar2.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)(local_1a8 + 0x18);
    ppuVar6 = &local_220;
    local_90 = ((aVar2.values_)->field_0).long_long_value;
    uVar5 = *(unsigned_long_long *)(local_1a8 + 0x20);
    s._M_str = in_stack_fffffffffffffd20;
    s._M_len = in_stack_fffffffffffffd18;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffd10,s);
    local_d8 = local_220;
    uStack_d0 = local_218;
    local_e0 = local_1b0;
    local_c8 = pvVar4;
    local_118[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                             (local_1b0,pvVar4,local_220);
    local_b8 = &local_100;
    local_c0 = local_118;
    local_a8 = 2;
    local_100 = 2;
    fmt.size_ = in_stack_ffffffffffffff90;
    fmt.data_ = (char *)ppuVar6;
    args_00.field_1.values_ = aVar2.values_;
    args_00.desc_ = uVar5;
    local_b0 = local_c0;
    local_a0 = local_b8;
    local_98 = local_c0;
    local_f8 = local_c0;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    ValidationReport::~ValidationReport(in_stack_fffffffffffffd10);
    std::allocator<char>::~allocator(&local_1f9);
  }
  return;
}

Assistant:

void warning(const IssueWarning& issue, Args&&... args) {
        ++numWarning;
        if (treatWarningsAsError) {
            returnCode = +rc::INVALID_FILE;
            callback(ValidationReport{IssueType::error, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});

        } else {
            callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
        }
    }